

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall cmParsePHPCoverage::ReadInt(cmParsePHPCoverage *this,istream *in,int *v)

{
  int iVar1;
  long *plVar2;
  char c;
  string s;
  char *local_40;
  undefined8 local_38;
  char local_30 [16];
  
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = '\0';
  while (plVar2 = (long *)std::istream::get((char *)in),
        (*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  iVar1 = atoi(local_40);
  *v = iVar1;
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool cmParsePHPCoverage::ReadInt(std::istream& in, int& v)
{
  std::string s;
  char c = 0;
  while(in.get(c) && c != ':' && c != ';')
    {
    s += c;
    }
  v = atoi(s.c_str());
  return true;
}